

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

BrotliDecoderErrorCode
duckdb_brotli::HuffmanTreeGroupDecode(HuffmanTreeGroup *group,BrotliDecoderStateInternal *s)

{
  BrotliDecoderErrorCode BVar1;
  int *piVar2;
  long in_RSI;
  long *in_RDI;
  BrotliDecoderErrorCode result;
  uint64_t table_size;
  BrotliMetablockHeaderArena *h;
  BrotliDecoderStateInternal *in_stack_00000040;
  uint64_t *in_stack_00000048;
  HuffmanCode *in_stack_00000050;
  uint64_t in_stack_00000058;
  uint64_t in_stack_00000060;
  long local_28;
  
  piVar2 = (int *)(in_RSI + 0x350);
  if (*piVar2 != 1) {
    *(long *)(in_RSI + 0xa70) = in_RDI[1];
    *(undefined4 *)(in_RSI + 0xa6c) = 0;
    *piVar2 = 1;
  }
  while( true ) {
    if ((int)(uint)*(ushort *)((long)in_RDI + 0x14) <= *(int *)(in_RSI + 0xa6c)) {
      *piVar2 = 0;
      return BROTLI_DECODER_SUCCESS;
    }
    BVar1 = ReadHuffmanCode(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
                            in_stack_00000040);
    if (BVar1 != BROTLI_DECODER_SUCCESS) break;
    *(undefined8 *)(*in_RDI + (long)*(int *)(in_RSI + 0xa6c) * 8) = *(undefined8 *)(in_RSI + 0xa70);
    *(long *)(in_RSI + 0xa70) = local_28 * 4 + *(long *)(in_RSI + 0xa70);
    *(int *)(in_RSI + 0xa6c) = *(int *)(in_RSI + 0xa6c) + 1;
  }
  return BVar1;
}

Assistant:

static BrotliDecoderErrorCode HuffmanTreeGroupDecode(HuffmanTreeGroup *group, BrotliDecoderState *s) {
	BrotliMetablockHeaderArena *h = &s->arena.header;
	if (h->substate_tree_group != BROTLI_STATE_TREE_GROUP_LOOP) {
		h->next = group->codes;
		h->htree_index = 0;
		h->substate_tree_group = BROTLI_STATE_TREE_GROUP_LOOP;
	}
	while (h->htree_index < group->num_htrees) {
		brotli_reg_t table_size;
		BrotliDecoderErrorCode result =
		    ReadHuffmanCode(group->alphabet_size_max, group->alphabet_size_limit, h->next, &table_size, s);
		if (result != BROTLI_DECODER_SUCCESS)
			return result;
		group->htrees[h->htree_index] = h->next;
		h->next += table_size;
		++h->htree_index;
	}
	h->substate_tree_group = BROTLI_STATE_TREE_GROUP_NONE;
	return BROTLI_DECODER_SUCCESS;
}